

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEquiv.c
# Opt level: O0

Vec_Int_t * Gia_ManOrigIdsRemapPairs(Vec_Int_t *vEquivPairs,int nObjs)

{
  int iVar1;
  int Two_00;
  Vec_Int_t *vMap;
  Vec_Int_t *p;
  int Two;
  int One;
  int i;
  Vec_Int_t *vMap2Smaller;
  Vec_Int_t *vMapResult;
  int nObjs_local;
  Vec_Int_t *vEquivPairs_local;
  
  vMap = Vec_IntStartFull(nObjs);
  for (Two = 0; iVar1 = Vec_IntSize(vEquivPairs), Two + 1 < iVar1; Two = Two + 2) {
    iVar1 = Vec_IntEntry(vEquivPairs,Two);
    Two_00 = Vec_IntEntry(vEquivPairs,Two + 1);
    Gia_ManOrigIdsRemapPairsInsert(vMap,iVar1,Two_00);
  }
  p = Vec_IntStartFull(nObjs);
  for (Two = 0; iVar1 = Vec_IntSize(vMap), Two < iVar1; Two = Two + 1) {
    iVar1 = Vec_IntEntry(vMap,Two);
    if (-1 < iVar1) {
      iVar1 = Gia_ManOrigIdsRemapPairsExtract(vMap,iVar1);
      Vec_IntWriteEntry(p,Two,iVar1);
    }
  }
  Vec_IntFree(vMap);
  return p;
}

Assistant:

Vec_Int_t * Gia_ManOrigIdsRemapPairs( Vec_Int_t * vEquivPairs, int nObjs )
{
    Vec_Int_t * vMapResult;
    Vec_Int_t * vMap2Smaller;
    int i, One, Two;
    // map bigger into smaller one
    vMap2Smaller = Vec_IntStartFull( nObjs );
    Vec_IntForEachEntryDouble( vEquivPairs, One, Two, i )
        Gia_ManOrigIdsRemapPairsInsert( vMap2Smaller, One, Two );
    // collect results in the topo order
    vMapResult = Vec_IntStartFull( nObjs );
    Vec_IntForEachEntry( vMap2Smaller, One, i )
        if ( One >= 0 )
            Vec_IntWriteEntry( vMapResult, i, Gia_ManOrigIdsRemapPairsExtract(vMap2Smaller, One) );
    Vec_IntFree( vMap2Smaller );
    return vMapResult;
}